

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O0

void __thiscall re2c::Linear::~Linear(Linear *this)

{
  Cond *this_00;
  size_type sVar1;
  reference pvVar2;
  uint local_14;
  uint32_t i;
  Linear *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
            ::size(&this->branches);
    if (sVar1 <= local_14) break;
    pvVar2 = std::
             vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
             ::operator[](&this->branches,(ulong)local_14);
    this_00 = pvVar2->first;
    if (this_00 != (Cond *)0x0) {
      Cond::~Cond(this_00);
      operator_delete(this_00,0x28);
    }
    local_14 = local_14 + 1;
  }
  std::
  vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
  ::~vector(&this->branches);
  return;
}

Assistant:

Linear::~Linear ()
{
	for (uint32_t i = 0; i < branches.size (); ++i)
	{
		delete branches[i].first;
	}
}